

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<32768U,_unsigned_int,_void,_false>::mul_by_limb
          (uintwide_t<32768U,_unsigned_int,_void,_false> *this,limb_type v)

{
  long lVar1;
  
  if (v != 1) {
    if (v == 0) {
      for (lVar1 = 0; lVar1 != 0x1000; lVar1 = lVar1 + 4) {
        *(undefined4 *)(this + lVar1) = 0;
      }
    }
    else {
      uintwide_t<32768u,unsigned_int,void,false>::
      eval_multiply_1d<unsigned_int*,unsigned_int_const*>((uint *)this,(uint *)this,v,0x400);
    }
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto mul_by_limb(const limb_type v) -> uintwide_t&
    {
      if(v == static_cast<limb_type>(UINT8_C(0)))
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0)));
      }
      else if(v > static_cast<limb_type>(UINT8_C(1)))
      {
        static_cast<void>(eval_multiply_1d(values.begin(),
                                           values.cbegin(),
                                           v,
                                           number_of_limbs));
      }

      return *this;
    }